

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

Curl_dns_entry * fetch_addr(Curl_easy *data,char *hostname,int port)

{
  bool bVar1;
  int iVar2;
  long local_158;
  Curl_addrinfo *addr;
  _Bool found;
  long lStack_148;
  int pf;
  hostcache_prune_data user;
  char entry_id [262];
  size_t entry_len;
  Curl_dns_entry *dns;
  int port_local;
  char *hostname_local;
  Curl_easy *data_local;
  
  create_hostcache_id(hostname,port,(char *)&user.now,0x106);
  register0x00000000 = strlen((char *)&user.now);
  entry_len = (size_t)Curl_hash_pick((data->dns).hostcache,&user.now,register0x00000000 + 1);
  if (((void *)entry_len == (void *)0x0) && ((*(uint *)&(data->state).field_0x6d0 >> 0x13 & 1) != 0)
     ) {
    create_hostcache_id("*",port,(char *)&user.now,0x106);
    register0x00000000 = strlen((char *)&user.now);
    entry_len = (size_t)Curl_hash_pick((data->dns).hostcache,&user.now,register0x00000000 + 1);
  }
  if ((entry_len != 0) && ((data->set).dns_cache_timeout != -1)) {
    time(&user.cache_timeout);
    lStack_148 = (long)(data->set).dns_cache_timeout;
    iVar2 = hostcache_timestamp_remove(&stack0xfffffffffffffeb8,(void *)entry_len);
    if (iVar2 != 0) {
      Curl_infof(data,"Hostname in DNS cache was stale, zapped");
      entry_len = 0;
      Curl_hash_delete((data->dns).hostcache,&user.now,stack0xffffffffffffffd0 + 1);
    }
  }
  if ((entry_len != 0) && (data->conn->ip_version != '\0')) {
    addr._4_4_ = 2;
    bVar1 = false;
    local_158 = *(long *)entry_len;
    if (data->conn->ip_version == '\x02') {
      addr._4_4_ = 10;
    }
    for (; local_158 != 0; local_158 = *(long *)(local_158 + 0x28)) {
      if (*(int *)(local_158 + 4) == addr._4_4_) {
        bVar1 = true;
        break;
      }
    }
    if (!bVar1) {
      Curl_infof(data,"Hostname in DNS cache doesn\'t have needed family, zapped");
      entry_len = 0;
      Curl_hash_delete((data->dns).hostcache,&user.now,stack0xffffffffffffffd0 + 1);
    }
  }
  return (Curl_dns_entry *)entry_len;
}

Assistant:

static struct Curl_dns_entry *fetch_addr(struct Curl_easy *data,
                                         const char *hostname,
                                         int port)
{
  struct Curl_dns_entry *dns = NULL;
  size_t entry_len;
  char entry_id[MAX_HOSTCACHE_LEN];

  /* Create an entry id, based upon the hostname and port */
  create_hostcache_id(hostname, port, entry_id, sizeof(entry_id));
  entry_len = strlen(entry_id);

  /* See if its already in our dns cache */
  dns = Curl_hash_pick(data->dns.hostcache, entry_id, entry_len + 1);

  /* No entry found in cache, check if we might have a wildcard entry */
  if(!dns && data->state.wildcard_resolve) {
    create_hostcache_id("*", port, entry_id, sizeof(entry_id));
    entry_len = strlen(entry_id);

    /* See if it's already in our dns cache */
    dns = Curl_hash_pick(data->dns.hostcache, entry_id, entry_len + 1);
  }

  if(dns && (data->set.dns_cache_timeout != -1)) {
    /* See whether the returned entry is stale. Done before we release lock */
    struct hostcache_prune_data user;

    time(&user.now);
    user.cache_timeout = data->set.dns_cache_timeout;

    if(hostcache_timestamp_remove(&user, dns)) {
      infof(data, "Hostname in DNS cache was stale, zapped");
      dns = NULL; /* the memory deallocation is being handled by the hash */
      Curl_hash_delete(data->dns.hostcache, entry_id, entry_len + 1);
    }
  }

  /* See if the returned entry matches the required resolve mode */
  if(dns && data->conn->ip_version != CURL_IPRESOLVE_WHATEVER) {
    int pf = PF_INET;
    bool found = false;
    struct Curl_addrinfo *addr = dns->addr;

#ifdef PF_INET6
    if(data->conn->ip_version == CURL_IPRESOLVE_V6)
      pf = PF_INET6;
#endif

    while(addr) {
      if(addr->ai_family == pf) {
        found = true;
        break;
      }
      addr = addr->ai_next;
    }

    if(!found) {
      infof(data, "Hostname in DNS cache doesn't have needed family, zapped");
      dns = NULL; /* the memory deallocation is being handled by the hash */
      Curl_hash_delete(data->dns.hostcache, entry_id, entry_len + 1);
    }
  }
  return dns;
}